

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

bool __thiscall duckdb_re2::DFA::InlinedSearchLoop<true,true,true>(DFA *this,SearchParams *params)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  State *pSVar5;
  State *pSVar6;
  State *state;
  uint uVar7;
  byte *data;
  byte *pbVar8;
  size_t sVar9;
  long lVar10;
  int c;
  ulong uVar11;
  Prog *local_228;
  byte *local_220;
  Prog *local_218;
  StateSaver local_208;
  StateSaver local_1e0;
  Prog *local_1b8;
  undefined1 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  data = (byte *)(params->text).data_;
  pSVar6 = params->start;
  if ((pSVar6->flag_ & 0x100) == 0) {
    pbVar3 = data + (params->text).size_;
    local_228 = this->prog_;
    pbVar8 = (byte *)0x0;
    local_218 = (Prog *)0x0;
    local_220 = (byte *)0x0;
    state = pSVar6;
    local_1b8 = local_228;
    do {
      if ((data == pbVar3) ||
         ((pbVar4 = data, state == pSVar6 &&
          (pbVar4 = (byte *)Prog::PrefixAccel(this->prog_,data,(long)pbVar3 - (long)data),
          data = pbVar3, pbVar4 == (byte *)0x0)))) {
        pbVar4 = (byte *)((params->text).data_ + (params->text).size_);
        if (pbVar4 == (byte *)((params->context).data_ + (params->context).size_)) {
          uVar11 = 0x100;
        }
        else {
          uVar11 = (ulong)*pbVar4;
        }
        c = (int)uVar11;
        if (c == 0x100) {
          uVar7 = this->prog_->bytemap_range_;
        }
        else {
          uVar7 = (uint)this->prog_->bytemap_[uVar11];
        }
        pSVar6 = state->next_[(int)uVar7]._M_b._M_p;
        if ((pSVar6 == (State *)0x0) &&
           (pSVar6 = RunStateOnByteUnlocked(this,state,c), pSVar6 == (State *)0x0)) {
          if (state < (State *)0x3) {
            local_208.inst_ = (int *)0x0;
            local_208.ninst_ = 0;
            local_208.flag_ = 0;
            local_208.is_special_ = true;
            local_208.dfa_ = this;
            local_208.special_ = state;
          }
          else {
            local_208.is_special_ = false;
            local_208.special_ = (State *)0x0;
            local_208.ninst_ = state->ninst_;
            local_208.flag_ = state->flag_;
            lVar10 = (long)local_208.ninst_;
            uVar11 = 0xffffffffffffffff;
            if (-1 < local_208.ninst_) {
              uVar11 = lVar10 * 4;
            }
            local_208.dfa_ = this;
            local_208.inst_ = (int *)operator_new__(uVar11);
            memmove(local_208.inst_,state->inst_,lVar10 * 4);
          }
          ResetCache(this,params->cache_lock);
          pSVar6 = StateSaver::Restore(&local_208);
          if (pSVar6 == (State *)0x0) {
LAB_0185ce75:
            params->failed = true;
            bVar2 = false;
            pSVar6 = (State *)0x0;
            local_228._0_1_ = 0;
          }
          else {
            pSVar6 = RunStateOnByteUnlocked(this,pSVar6,c);
            if (pSVar6 == (State *)0x0) {
              local_1b0 = 0;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"RunStateOnByteUnlocked failed after Reset",0x29);
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_0185ce75;
            }
            bVar2 = true;
          }
          if ((local_208.is_special_ == false) && (local_208.inst_ != (int *)0x0)) {
            operator_delete__(local_208.inst_);
          }
          if (!bVar2) break;
        }
        if (pSVar6 < (State *)0x3) {
          if (pSVar6 == (State *)&DAT_00000001) goto LAB_0185cf26;
          params->ep = (char *)pbVar3;
          goto LAB_0185cd07;
        }
        if (((((pSVar6->flag_ & 0x100) == 0) ||
             (local_218._0_1_ = 1, pbVar8 = data, params->matches == (SparseSet *)0x0)) ||
            (this->kind_ != kManyMatch)) || ((long)pSVar6->ninst_ < 1)) goto LAB_0185cf26;
        lVar10 = (long)pSVar6->ninst_ + 1;
        goto LAB_0185cee3;
      }
      data = pbVar4 + 1;
      bVar1 = *pbVar4;
      pSVar5 = state->next_[local_1b8->bytemap_[bVar1]]._M_b._M_p;
      if (pSVar5 == (State *)0x0) {
        pSVar5 = RunStateOnByteUnlocked(this,state,(uint)bVar1);
        if (pSVar5 != (State *)0x0) goto LAB_0185c9b4;
        if (((dfa_should_bail_when_slow == '\x01') && (local_220 != (byte *)0x0)) &&
           (((ulong)((long)data - (long)local_220) < (this->state_cache_)._M_h._M_element_count * 10
            && (this->kind_ != kManyMatch)))) {
          params->failed = true;
          bVar2 = false;
          local_228 = (Prog *)0x0;
          pSVar5 = state;
        }
        else {
          if (pSVar6 < (State *)0x3) {
            local_208.inst_ = (int *)0x0;
            local_208.ninst_ = 0;
            local_208.flag_ = 0;
            local_208.is_special_ = true;
            local_208.dfa_ = this;
            local_208.special_ = pSVar6;
          }
          else {
            local_208.is_special_ = false;
            local_208.special_ = (State *)0x0;
            local_208.ninst_ = pSVar6->ninst_;
            local_208.flag_ = pSVar6->flag_;
            lVar10 = (long)local_208.ninst_;
            sVar9 = lVar10 * 4;
            if (local_208.ninst_ < 0) {
              sVar9 = 0xffffffffffffffff;
            }
            local_208.dfa_ = this;
            local_208.inst_ = (int *)operator_new__(sVar9);
            memmove(local_208.inst_,pSVar6->inst_,lVar10 * 4);
          }
          local_1e0.dfa_ = this;
          if (state < (State *)0x3) {
            local_1e0.inst_ = (int *)0x0;
            local_1e0.ninst_ = 0;
            local_1e0.flag_ = 0;
            local_1e0.is_special_ = true;
            local_1e0.special_ = state;
          }
          else {
            local_1e0.is_special_ = false;
            local_1e0.special_ = (State *)0x0;
            local_1e0.ninst_ = state->ninst_;
            local_1e0.flag_ = state->flag_;
            lVar10 = (long)local_1e0.ninst_;
            sVar9 = lVar10 * 4;
            if (local_1e0.ninst_ < 0) {
              sVar9 = 0xffffffffffffffff;
            }
            local_1e0.inst_ = (int *)operator_new__(sVar9);
            memmove(local_1e0.inst_,state->inst_,lVar10 * 4);
          }
          ResetCache(this,params->cache_lock);
          pSVar6 = StateSaver::Restore(&local_208);
          if (pSVar6 == (State *)0x0) {
LAB_0185cc4a:
            params->failed = true;
            bVar2 = false;
            pSVar5 = (State *)0x0;
            local_228 = (Prog *)0x0;
          }
          else {
            state = StateSaver::Restore(&local_1e0);
            if (state == (State *)0x0) {
              state = (State *)0x0;
              goto LAB_0185cc4a;
            }
            pSVar5 = RunStateOnByteUnlocked(this,state,(uint)bVar1);
            if (pSVar5 == (State *)0x0) {
              local_1b0 = 0;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"RunStateOnByteUnlocked failed after ResetCache",0x2e)
              ;
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_0185cc4a;
            }
            bVar2 = true;
          }
          if ((local_1e0.is_special_ == false) && (local_1e0.inst_ != (int *)0x0)) {
            operator_delete__(local_1e0.inst_);
          }
          if ((local_208.is_special_ == false) && (local_208.inst_ != (int *)0x0)) {
            operator_delete__(local_208.inst_);
          }
          local_220 = data;
          if (bVar2) goto LAB_0185c9b4;
          bVar2 = false;
          pSVar5 = state;
        }
      }
      else {
LAB_0185c9b4:
        if (pSVar5 < (State *)0x3) {
          if (pSVar5 == (State *)&DAT_00000001) {
            params->ep = (char *)pbVar8;
            goto LAB_0185ca60;
          }
          params->ep = (char *)pbVar3;
          local_228 = (Prog *)0x1;
          bVar2 = false;
          pSVar5 = state;
        }
        else {
          bVar2 = true;
          if ((pSVar5->flag_ & 0x100) != 0) {
            if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
               (0 < (long)pSVar5->ninst_)) {
              lVar10 = (long)pSVar5->ninst_ + 1;
              do {
                if (pSVar5->inst_[lVar10 + -2] == -2) break;
                SparseSetT<void>::InsertInternal(params->matches,true,pSVar5->inst_[lVar10 + -2]);
                lVar10 = lVar10 + -1;
              } while (1 < lVar10);
            }
            params->ep = (char *)pbVar4;
            local_218 = (Prog *)0x1;
            state = pSVar5;
            pbVar8 = pbVar4;
LAB_0185ca60:
            bVar2 = false;
            pSVar5 = state;
            local_228 = local_218;
          }
        }
      }
      state = pSVar5;
    } while (bVar2);
  }
  else {
    if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
       (0 < (long)pSVar6->ninst_)) {
      lVar10 = (long)pSVar6->ninst_ + 1;
      do {
        if (pSVar6->inst_[lVar10 + -2] == -2) break;
        SparseSetT<void>::InsertInternal(params->matches,true,pSVar6->inst_[lVar10 + -2]);
        lVar10 = lVar10 + -1;
      } while (1 < lVar10);
    }
    params->ep = (char *)data;
LAB_0185cd07:
    local_228._0_1_ = 1;
  }
LAB_0185cf39:
  return (bool)((byte)local_228 & 1);
  while( true ) {
    SparseSetT<void>::InsertInternal(params->matches,true,pSVar6->inst_[lVar10 + -2]);
    lVar10 = lVar10 + -1;
    if (lVar10 < 2) break;
LAB_0185cee3:
    if (pSVar6->inst_[lVar10 + -2] == -2) break;
  }
LAB_0185cf26:
  params->ep = (char *)pbVar8;
  local_228._0_1_ = (byte)local_218;
  goto LAB_0185cf39;
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params) {
  State* start = params->start;
  const uint8_t* bp = BytePtr(params->text.data());  // start of text
  const uint8_t* p = bp;                             // text scanning point
  const uint8_t* ep = BytePtr(params->text.data() +
                              params->text.size());  // end of text
  const uint8_t* resetp = NULL;                      // p at last cache reset
  if (!run_forward) {
    using std::swap;
    swap(p, ep);
  }

  const uint8_t* bytemap = prog_->bytemap();
  const uint8_t* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;

  State* s = start;

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {

    if (can_prefix_accel && s == start) {
      // In start state, only way out is to find the prefix,
      // so we use prefix accel (e.g. memchr) to skip ahead.
      // If not found, we can skip to the end of the string.
      p = BytePtr(prog_->PrefixAccel(p, ep - p));
      if (p == NULL) {
        p = ep;
        break;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.  However, RE2::Set cannot fall back,
        // so we just have to keep on keeping on in that case.
        if (dfa_should_bail_when_slow && resetp != NULL &&
            static_cast<size_t>(p - resetp) < 10*state_cache_.size() &&
            kind_ != Prog::kManyMatch) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }

    s = ns;
    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (params->matches != NULL && kind_ == Prog::kManyMatch) {
        for (int i = s->ninst_ - 1; i >= 0; i--) {
          int id = s->inst_[i];
          if (id == MatchSep)
            break;
          params->matches->insert(id);
        }
      }
      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)

  int lastbyte;
  if (run_forward) {
    if (EndPtr(params->text) == EndPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = EndPtr(params->text)[0] & 0xFF;
  } else {
    if (BeginPtr(params->text) == BeginPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = BeginPtr(params->text)[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  if (ns <= SpecialStateMax) {
    if (ns == DeadState) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return matched;
    }
    // FullMatchState
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }

  s = ns;
  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
  }

  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}